

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_soa.h
# Opt level: O3

GridSOA * embree::sse2::GridSOA::create<embree::FastAllocator::CachedAllocator>
                    (SubdivPatch1Base *patches,uint time_steps,uint x0,uint x1,uint y0,uint y1,
                    Scene *scene,CachedAllocator *alloc,BBox3fa *bounds_o)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  FastAllocator *this;
  ThreadLocal *pTVar3;
  ThreadLocal2 *this_00;
  iterator __position;
  undefined8 *puVar4;
  undefined8 *puVar5;
  size_t sVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  GridSOA *this_01;
  uint uVar10;
  size_t sVar11;
  GridRange range;
  undefined8 *local_70;
  undefined8 *local_68;
  undefined1 local_60;
  ThreadLocal2 *local_58;
  char local_50;
  size_t local_48;
  ThreadLocal2 *local_40;
  range<int> local_38;
  
  uVar8 = x1 - x0;
  uVar10 = y1 - y0;
  range.u_start = 0;
  range.v_start = 0;
  range.u_end = uVar8;
  range.v_end = uVar10;
  if (time_steps == 1) {
    local_48 = getBVHBytes(&range,0x80,0);
  }
  else {
    sVar11 = getBVHBytes(&range,0xe0,0);
    local_38._begin = 0;
    local_38._end = time_steps - 1;
    local_48 = getTemporalBVHBytes(&local_38,0x100);
    local_48 = local_48 + sVar11 * (time_steps - 1);
  }
  sVar11 = (ulong)(uVar10 + 1) * (ulong)(uVar8 + 1) * 0x10;
  local_70 = (undefined8 *)(local_48 + (sVar11 + 8) * (ulong)time_steps + 0x30);
  this = alloc->alloc;
  pTVar3 = alloc->talloc0;
  this_00 = pTVar3->parent;
  if (this != (this_00->alloc)._M_b._M_p) {
    local_50 = '\x01';
    local_58 = this_00;
    MutexSys::lock(&this_00->mutex);
    if ((this_00->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesUsed + (this_00->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_00->alloc0).end + (this_00->alloc1).end) -
           ((this_00->alloc0).cur + (this_00->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesWasted + (this_00->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_00->alloc0).bytesUsed = 0;
    (this_00->alloc0).bytesWasted = 0;
    (this_00->alloc0).end = 0;
    (this_00->alloc0).allocBlockSize = 0;
    (this_00->alloc0).ptr = (char *)0x0;
    (this_00->alloc0).cur = 0;
    if (this == (FastAllocator *)0x0) {
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
    }
    else {
      (this_00->alloc0).allocBlockSize = this->defaultBlockSize;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).allocBlockSize = this->defaultBlockSize;
    }
    LOCK();
    (this_00->alloc)._M_b._M_p = this;
    UNLOCK();
    local_68 = &FastAllocator::s_thread_local_allocators_lock;
    local_60 = 1;
    local_40 = this_00;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (this->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&this->thread_local_allocators,__position,&local_40);
    }
    else {
      *__position._M_current = this_00;
      pppTVar2 = &(this->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if (local_50 == '\x01') {
      MutexSys::unlock(&local_58->mutex);
    }
  }
  puVar5 = local_70;
  pTVar3->bytesUsed = pTVar3->bytesUsed + (long)local_70;
  sVar6 = pTVar3->cur;
  uVar7 = (ulong)(-(int)sVar6 & 0xf);
  uVar9 = (long)local_70 + uVar7 + sVar6;
  pTVar3->cur = uVar9;
  if (pTVar3->end < uVar9) {
    pTVar3->cur = sVar6;
    puVar4 = (undefined8 *)pTVar3->allocBlockSize;
    if ((undefined8 *)((long)local_70 * 4) < puVar4 || (long)local_70 * 4 - (long)puVar4 == 0) {
      local_68 = puVar4;
      this_01 = (GridSOA *)FastAllocator::malloc(this,(size_t)&local_68);
      pTVar3->ptr = (char *)this_01;
      sVar6 = (pTVar3->end - pTVar3->cur) + pTVar3->bytesWasted;
      pTVar3->bytesWasted = sVar6;
      pTVar3->end = (size_t)local_68;
      pTVar3->cur = (size_t)puVar5;
      if (local_68 < puVar5) {
        pTVar3->cur = 0;
        local_68 = (undefined8 *)pTVar3->allocBlockSize;
        this_01 = (GridSOA *)FastAllocator::malloc(this,(size_t)&local_68);
        pTVar3->ptr = (char *)this_01;
        sVar6 = (pTVar3->end - pTVar3->cur) + pTVar3->bytesWasted;
        pTVar3->bytesWasted = sVar6;
        pTVar3->end = (size_t)local_68;
        pTVar3->cur = (size_t)puVar5;
        if (local_68 < puVar5) {
          pTVar3->cur = 0;
          this_01 = (GridSOA *)0x0;
          goto LAB_00d786ae;
        }
      }
      pTVar3->bytesWasted = sVar6;
    }
    else {
      this_01 = (GridSOA *)FastAllocator::malloc(this,(size_t)&local_70);
    }
  }
  else {
    pTVar3->bytesWasted = pTVar3->bytesWasted + uVar7;
    this_01 = (GridSOA *)(pTVar3->ptr + (uVar9 - (long)local_70));
  }
LAB_00d786ae:
  GridSOA(this_01,patches,time_steps,x0,x1,y0,y1,(uint)patches->grid_u_res,(uint)patches->grid_v_res
          ,(SubdivMesh *)(scene->geometries).items[patches->geom].ptr,local_48,sVar11,bounds_o);
  return this_01;
}

Assistant:

static GridSOA* create(const SubdivPatch1Base* patches, const unsigned time_steps,
                               unsigned x0, unsigned x1, unsigned y0, unsigned y1, 
                               const Scene* scene, Allocator& alloc, BBox3fa* bounds_o = nullptr)
      {
        const unsigned width = x1-x0+1;  
        const unsigned height = y1-y0+1; 
        const GridRange range(0,width-1,0,height-1);
        size_t bvhBytes = 0;
        if (time_steps == 1) 
          bvhBytes = getBVHBytes(range,sizeof(BVH4::AABBNode),0);
        else {
          bvhBytes = (time_steps-1)*getBVHBytes(range,sizeof(BVH4::AABBNodeMB),0);
          bvhBytes += getTemporalBVHBytes(make_range(0,int(time_steps-1)),sizeof(BVH4::AABBNodeMB4D));
        }
        const size_t gridBytes = 4*size_t(width)*size_t(height)*sizeof(float);  
        size_t rootBytes = time_steps*sizeof(BVH4::NodeRef);
#if !defined(__64BIT__)
        rootBytes += 4; // We read 2 elements behind the grid. As we store at least 8 root bytes after the grid we are fine in 64 bit mode. But in 32 bit mode we have to do additional padding.
#endif
        void* data = alloc(offsetof(GridSOA,data)+bvhBytes+time_steps*gridBytes+rootBytes);
        assert(data);
        return new (data) GridSOA(patches,time_steps,x0,x1,y0,y1,patches->grid_u_res,patches->grid_v_res,scene->get<SubdivMesh>(patches->geomID()),bvhBytes,gridBytes,bounds_o);
      }